

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_queue.cpp
# Opt level: O0

void __thiscall miniros::SubscriptionQueue::clear(SubscriptionQueue *this)

{
  scoped_lock<std::mutex> *in_RDI;
  scoped_lock<std::mutex> queue_lock;
  scoped_lock<std::recursive_mutex> cb_lock;
  mutex_type *in_stack_ffffffffffffffc8;
  deque<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  *in_stack_fffffffffffffff0;
  
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffc8);
  std::scoped_lock<std::mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffffc8);
  std::deque<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>::
  clear(in_stack_fffffffffffffff0);
  *(undefined4 *)&in_RDI[0x17]._M_device = 0;
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4e5d00);
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x4e5d0a);
  return;
}

Assistant:

void SubscriptionQueue::clear()
{
  std::scoped_lock<std::recursive_mutex> cb_lock(callback_mutex_);
  std::scoped_lock<std::mutex> queue_lock(queue_mutex_);

  queue_.clear();
  queue_size_ = 0;
}